

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O3

int lws_tls_extant(char *name)

{
  int __fd;
  uint uVar1;
  ssize_t sVar2;
  char buf [1];
  undefined1 local_11;
  
  __fd = open(name,0);
  if (__fd < 0) {
    uVar1 = 1;
  }
  else {
    sVar2 = read(__fd,&local_11,1);
    close(__fd);
    uVar1 = (uint)((int)sVar2 != 1);
  }
  return uVar1;
}

Assistant:

static int
lws_tls_extant(const char *name)
{
	/* it exists if we can open it... */
	int fd = open(name, O_RDONLY), n;
	char buf[1];

	if (fd < 0)
		return 1;

	/* and we can read at least one byte out of it */
	n = read(fd, buf, 1);
	close(fd);

	return n != 1;
}